

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::lookingAtString(SelectionCompiler *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  byte bVar10;
  
  iVar2 = this->ichToken;
  iVar3 = this->cchScript;
  if (iVar2 != iVar3) {
    pcVar4 = (this->script)._M_dataplus._M_p;
    if (pcVar4[iVar2] == '\"') {
      iVar6 = iVar2 + 1;
      lVar8 = (long)iVar6;
      if (iVar6 < iVar3) {
        iVar6 = iVar3;
      }
      iVar9 = iVar2 + 2;
      bVar10 = 0;
      for (; (iVar7 = iVar6, lVar8 < iVar3 &&
             (cVar1 = pcVar4[lVar8], iVar7 = iVar9, (bool)(cVar1 != '\"' | bVar10)));
          lVar8 = lVar8 + 1) {
        bVar10 = (bVar10 ^ 1) & cVar1 == '\\';
        iVar9 = iVar9 + 1;
      }
      this->cchToken = iVar7 - iVar2;
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  return false;
}

Assistant:

bool SelectionCompiler::lookingAtString() {
    if (ichToken == cchScript) return false;
    if (script[ichToken] != '"') return false;
    // remove support for single quote
    // in order to use it in atom expressions
    //    char chFirst = script.charAt(ichToken);
    //    if (chFirst != '"' && chFirst != '\'')
    //      return false;
    int ichT = ichToken + 1;
    //    while (ichT < cchScript && script.charAt(ichT++) != chFirst)
    char ch;
    bool previousCharBackslash = false;
    while (ichT < cchScript) {
      ch = script[ichT++];
      if (ch == '"' && !previousCharBackslash) break;
      previousCharBackslash = ch == '\\' ? !previousCharBackslash : false;
    }
    cchToken = ichT - ichToken;

    return true;
  }